

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O0

string * __thiscall
bandit::reporter::xunit::escape(string *__return_storage_ptr__,xunit *this,string *str)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1c0;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  stringstream stm;
  ostream local_198 [376];
  string *local_20;
  string *str_local;
  xunit *this_local;
  
  local_20 = str;
  str_local = (string *)this;
  this_local = (xunit *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_1c0._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe40);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    cVar1 = *pcVar3;
    if (cVar1 == '\"') {
      std::operator<<(local_198,"&quot;");
    }
    else if (cVar1 == '&') {
      std::operator<<(local_198,"&amp;");
    }
    else if (cVar1 == '<') {
      std::operator<<(local_198,"&lt;");
    }
    else if (cVar1 == '>') {
      std::operator<<(local_198,"&gt;");
    }
    else if (cVar1 == '\\') {
      std::operator<<(local_198,"&apos;");
    }
    else {
      std::operator<<(local_198,cVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::string escape(const std::string& str) {
        std::stringstream stm;

        for (char c : str) {
          switch (c) {
          case '&':
            stm << "&amp;";
            break;
          case '<':
            stm << "&lt;";
            break;
          case '>':
            stm << "&gt;";
            break;
          case '\\':
            stm << "&apos;";
            break;
          case '\"':
            stm << "&quot;";
            break;
          default:
            stm << c;
          }
        }

        return stm.str();
      }